

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psroipooling.cpp
# Opt level: O1

int __thiscall
ncnn::PSROIPooling::forward
          (PSROIPooling *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  pointer pMVar7;
  Mat *this_00;
  undefined1 auVar8 [16];
  uint uVar9;
  uint uVar10;
  undefined4 extraout_EAX;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float local_12c;
  float local_128;
  float fStack_124;
  long local_110;
  ulong local_108;
  void *local_100;
  float fStack_d4;
  long local_b8;
  
  pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar25 = -1;
  if (pMVar7->c == this->pooled_width * this->output_dim * this->pooled_height) {
    uVar4 = pMVar7->w;
    uVar14 = (ulong)(int)uVar4;
    uVar5 = pMVar7->h;
    this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_00,this->pooled_width,this->pooled_height,this->output_dim,pMVar7->elemsize,
                opt->blob_allocator);
    iVar25 = -100;
    if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
      uVar2 = *pMVar7[1].data;
      uVar3 = *(undefined8 *)((long)pMVar7[1].data + 8);
      fVar27 = roundf((float)uVar2);
      fStack_d4 = (float)((ulong)uVar2 >> 0x20);
      fVar28 = roundf(fStack_d4);
      fVar31 = this->spatial_scale;
      fVar27 = fVar27 * fVar31;
      fVar28 = fVar28 * fVar31;
      local_128 = (float)uVar3;
      fStack_124 = (float)((ulong)uVar3 >> 0x20);
      fVar29 = roundf(local_128 + 1.0);
      fVar30 = roundf(fStack_124 + 1.0);
      fVar29 = fVar29 * fVar31 - fVar27;
      fVar31 = fVar30 * fVar31 - fVar28;
      iVar25 = -(uint)(fVar29 < 0.1);
      iVar26 = -(uint)(fVar31 < 0.1);
      auVar8._4_4_ = iVar25;
      auVar8._0_4_ = iVar25;
      auVar8._8_4_ = iVar26;
      auVar8._12_4_ = iVar26;
      uVar11 = movmskpd(extraout_EAX,auVar8);
      local_12c = 0.1;
      local_128 = 0.1;
      if ((uVar11 & 1) == 0) {
        local_128 = fVar29;
      }
      if ((uVar11 & 2) == 0) {
        local_12c = fVar31;
      }
      iVar25 = this->output_dim;
      if (0 < (long)iVar25) {
        local_128 = local_128 / (float)this->pooled_width;
        local_12c = local_12c / (float)this->pooled_height;
        uVar11 = this->pooled_width;
        uVar6 = this->pooled_height;
        lVar15 = (long)(int)uVar11;
        local_110 = 0;
        do {
          if (0 < (int)uVar6) {
            local_100 = (void *)(this_00->cstep * local_110 * this_00->elemsize +
                                (long)this_00->data);
            local_b8 = (this->pooled_height * (int)local_110) * lVar15;
            local_108 = 0;
            do {
              if (0 < (int)uVar11) {
                fVar31 = floorf((float)(int)local_108 * local_12c + fVar28);
                fVar29 = ceilf((float)((int)local_108 + 1) * local_12c + fVar28);
                uVar19 = (uint)fVar29;
                uVar9 = (int)fVar31;
                if ((int)fVar31 < 1) {
                  uVar9 = 0;
                }
                uVar12 = uVar9;
                if ((int)uVar5 < (int)uVar9) {
                  uVar12 = uVar5;
                }
                if ((int)uVar19 < 1) {
                  uVar19 = 0;
                }
                if ((int)uVar5 < (int)uVar19) {
                  uVar19 = uVar5;
                }
                uVar16 = (long)(int)uVar5;
                if ((long)(ulong)uVar9 < (long)(int)uVar5) {
                  uVar16 = (ulong)uVar9;
                }
                lVar21 = pMVar7->cstep * pMVar7->elemsize;
                lVar24 = uVar14 * 4 * uVar16 + lVar21 * local_b8 + (long)pMVar7->data;
                uVar23 = 0;
                do {
                  fVar31 = floorf((float)(int)uVar23 * local_128 + fVar27);
                  uVar1 = uVar23 + 1;
                  fVar29 = ceilf((float)(int)uVar1 * local_128 + fVar27);
                  uVar13 = (uint)fVar29;
                  uVar10 = (int)fVar31;
                  if ((int)fVar31 < 1) {
                    uVar10 = 0;
                  }
                  uVar17 = uVar10;
                  if ((int)uVar4 < (int)uVar10) {
                    uVar17 = uVar4;
                  }
                  if ((int)uVar13 < 1) {
                    uVar13 = 0;
                  }
                  if ((int)uVar4 < (int)uVar13) {
                    uVar13 = uVar4;
                  }
                  fVar31 = 0.0;
                  fVar29 = 0.0;
                  if ((int)uVar9 < (int)uVar19) {
                    uVar20 = (ulong)uVar10;
                    if ((long)uVar14 <= (long)(ulong)uVar10) {
                      uVar20 = uVar14;
                    }
                    lVar18 = lVar24 + uVar20 * 4;
                    uVar20 = uVar16;
                    do {
                      if ((int)uVar10 < (int)uVar13) {
                        lVar22 = 0;
                        do {
                          fVar29 = fVar29 + *(float *)(lVar18 + lVar22 * 4);
                          lVar22 = lVar22 + 1;
                        } while (uVar13 - uVar17 != (int)lVar22);
                      }
                      uVar20 = uVar20 + 1;
                      lVar18 = lVar18 + uVar14 * 4;
                    } while (((int)uVar16 + uVar19) - uVar12 != (int)uVar20);
                  }
                  if ((int)uVar9 < (int)uVar19 && (int)uVar10 < (int)uVar13) {
                    fVar31 = fVar29 / (float)(int)((uVar13 - uVar17) * (uVar19 - uVar12));
                  }
                  *(float *)((long)local_100 + uVar23 * 4) = fVar31;
                  lVar24 = lVar24 + lVar21;
                  uVar23 = uVar1;
                } while (uVar1 != uVar11);
              }
              local_100 = (void *)((long)local_100 + lVar15 * 4);
              local_108 = local_108 + 1;
              local_b8 = local_b8 + lVar15;
            } while (local_108 != uVar6);
          }
          local_110 = local_110 + 1;
        } while (local_110 != iVar25);
      }
      iVar25 = 0;
    }
  }
  return iVar25;
}

Assistant:

int PSROIPooling::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    if (channels != output_dim * pooled_width * pooled_height)
    {
        // input channel number does not match layer parameters
        return -1;
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, output_dim, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: avg pool over R
    const float* roi_ptr = roi_blob;

    float roi_x1 = static_cast<float>(round(roi_ptr[0]) * spatial_scale);
    float roi_y1 = static_cast<float>(round(roi_ptr[1]) * spatial_scale);
    float roi_x2 = static_cast<float>(round(roi_ptr[2] + 1.f) * spatial_scale);
    float roi_y2 = static_cast<float>(round(roi_ptr[3] + 1.f) * spatial_scale);

    float roi_w = std::max(roi_x2 - roi_x1, 0.1f);
    float roi_h = std::max(roi_y2 - roi_y1, 0.1f);

    float bin_size_w = roi_w / (float)pooled_width;
    float bin_size_h = roi_h / (float)pooled_height;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < output_dim; q++)
    {
        float* outptr = top_blob.channel(q);

        for (int ph = 0; ph < pooled_height; ph++)
        {
            for (int pw = 0; pw < pooled_width; pw++)
            {
                const float* ptr = bottom_blob.channel((q * pooled_height + ph) * pooled_width + pw);

                int hstart = static_cast<int>(floor(roi_y1 + (float)(ph)*bin_size_h));
                int wstart = static_cast<int>(floor(roi_x1 + (float)(pw)*bin_size_w));
                int hend = static_cast<int>(ceil(roi_y1 + (float)(ph + 1) * bin_size_h));
                int wend = static_cast<int>(ceil(roi_x1 + (float)(pw + 1) * bin_size_w));

                hstart = std::min(std::max(hstart, 0), h);
                wstart = std::min(std::max(wstart, 0), w);
                hend = std::min(std::max(hend, 0), h);
                wend = std::min(std::max(wend, 0), w);

                bool is_empty = (hend <= hstart) || (wend <= wstart);
                int area = (hend - hstart) * (wend - wstart);

                float sum = 0.f;
                for (int y = hstart; y < hend; y++)
                {
                    for (int x = wstart; x < wend; x++)
                    {
                        int index = y * w + x;
                        sum += ptr[index];
                    }
                }

                outptr[pw] = is_empty ? 0.f : (sum / (float)area);
            }

            outptr += pooled_width;
        }
    }

    return 0;
}